

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

int float64_eq_ppc(float64 a,float64 b,float_status *status)

{
  int iVar1;
  float64 a_00;
  float64 a_01;
  uint64_t uVar2;
  bool local_39;
  uint64_t bv;
  uint64_t av;
  float_status *status_local;
  float64 b_local;
  float64 a_local;
  
  a_00 = float64_squash_input_denormal_ppc(a,status);
  a_01 = float64_squash_input_denormal_ppc(b,status);
  iVar1 = extractFloat64Exp(a_00);
  if (((iVar1 == 0x7ff) && (uVar2 = extractFloat64Frac(a_00), uVar2 != 0)) ||
     ((iVar1 = extractFloat64Exp(a_01), iVar1 == 0x7ff &&
      (uVar2 = extractFloat64Frac(a_01), uVar2 != 0)))) {
    float_raise_ppc('\x01',status);
    a_local._4_4_ = 0;
  }
  else {
    local_39 = a_00 == a_01 || ((a_00 | a_01) & 0x7fffffffffffffff) == 0;
    a_local._4_4_ = (uint)local_39;
  }
  return a_local._4_4_;
}

Assistant:

int float64_eq(float64 a, float64 b, float_status *status)
{
    uint64_t av, bv;
    a = float64_squash_input_denormal(a, status);
    b = float64_squash_input_denormal(b, status);

    if (    ( ( extractFloat64Exp( a ) == 0x7FF ) && extractFloat64Frac( a ) )
         || ( ( extractFloat64Exp( b ) == 0x7FF ) && extractFloat64Frac( b ) )
       ) {
        float_raise(float_flag_invalid, status);
        return 0;
    }
    av = float64_val(a);
    bv = float64_val(b);
    return ( av == bv ) || ( (uint64_t) ( ( av | bv )<<1 ) == 0 );

}